

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  BYTE *pInLimit;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  byte bVar9;
  undefined8 uVar10;
  char cVar11;
  size_t sVar12;
  long *plVar13;
  seqDef *psVar14;
  byte bVar15;
  uint uVar16;
  long *plVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  long *plVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  long *plVar29;
  long *plVar30;
  U32 UVar31;
  int iVar32;
  long *plVar33;
  ulong uVar34;
  BYTE *litEnd;
  long *plVar35;
  ulong uVar36;
  uint local_cc;
  uint local_b0;
  BYTE *litLimit_w_1;
  long *local_90;
  BYTE *litLimit_w_3;
  BYTE *litLimit_w;
  
  pBVar5 = (ms->window).base;
  pInLimit = (BYTE *)((long)src + srcSize);
  iVar27 = (int)pBVar5;
  iVar28 = (int)pInLimit - iVar27;
  uVar26 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar4 = (ms->window).dictLimit;
  uVar16 = iVar28 - uVar26;
  if (iVar28 - uVar4 <= uVar26) {
    uVar16 = uVar4;
  }
  if (ms->loadedDictEnd != 0) {
    uVar16 = uVar4;
  }
  plVar29 = (long *)(pBVar5 + uVar16);
  plVar35 = (long *)((ulong)(plVar29 == (long *)src) + (long)src);
  iVar28 = (int)plVar35 - iVar27;
  uVar19 = iVar28 - uVar26;
  if (iVar28 - uVar4 <= uVar26) {
    uVar19 = uVar4;
  }
  if (ms->loadedDictEnd != 0) {
    uVar19 = uVar4;
  }
  uVar4 = *rep;
  uVar26 = rep[1];
  uVar19 = iVar28 - uVar19;
  local_b0 = uVar26;
  if (uVar19 < uVar26) {
    local_b0 = 0;
  }
  local_cc = 0;
  if (uVar4 <= uVar19) {
    local_cc = uVar4;
  }
  bVar9 = 0x40 - (char)(ms->cParams).hashLog;
  uVar20 = (ms->cParams).minMatch;
  pUVar6 = ms->hashTable;
  pUVar7 = ms->chainTable;
  plVar17 = (long *)((long)src + (srcSize - 8));
  cVar11 = (char)(ms->cParams).chainLog;
  if (uVar20 == 5) {
    bVar15 = 0x40 - cVar11;
    plVar1 = (long *)(pInLimit + -0x20);
LAB_01becd35:
    local_90 = (long *)src;
    if ((long *)((long)plVar35 + 1) <= plVar17) {
      uVar22 = (ulong)(*plVar35 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
      plVar13 = plVar35 + 0x20;
      uVar34 = (ulong)pUVar6[uVar22];
      plVar30 = (long *)(pBVar5 + uVar34);
      uVar36 = 1;
      lVar25 = *plVar35;
      plVar21 = (long *)((long)plVar35 + 1);
      while( true ) {
        plVar33 = plVar21;
        uVar24 = (ulong)(lVar25 * -0x30e4432345000000) >> (bVar15 & 0x3f);
        uVar20 = pUVar7[uVar24];
        iVar28 = (int)plVar35;
        UVar31 = iVar28 - iVar27;
        pUVar7[uVar24] = UVar31;
        pUVar6[uVar22] = UVar31;
        if ((local_cc != 0) &&
           (*(int *)((long)plVar35 + -(ulong)local_cc + 1) == *(int *)((long)plVar35 + 1))) break;
        lVar18 = *plVar33;
        uVar22 = (ulong)(lVar18 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
        iVar32 = (int)plVar33;
        if ((uVar16 < (uint)uVar34) && (*plVar30 == lVar25)) {
          sVar12 = ZSTD_count((BYTE *)(plVar35 + 1),(BYTE *)(plVar30 + 1),pInLimit);
          lVar25 = sVar12 + 8;
          uVar20 = iVar28 - (int)plVar30;
          for (; ((plVar29 < plVar30 && (src < plVar35)) &&
                 (*(BYTE *)((long)plVar35 + -1) == *(BYTE *)((long)plVar30 + -1)));
              plVar35 = (long *)((long)plVar35 + -1)) {
            plVar30 = (long *)((long)plVar30 + -1);
            lVar25 = lVar25 + 1;
          }
          goto LAB_01bed078;
        }
        uVar34 = (ulong)pUVar6[uVar22];
        plVar30 = (long *)(pBVar5 + uVar34);
        if ((uVar16 < uVar20) &&
           (plVar21 = (long *)(pBVar5 + uVar20), (int)*plVar21 == (int)*plVar35)) goto LAB_01becfbe;
        if (plVar13 <= plVar33) {
          uVar36 = uVar36 + 1;
          plVar13 = plVar13 + 0x20;
        }
        lVar25 = lVar18;
        plVar21 = (long *)(uVar36 + (long)plVar33);
        plVar35 = plVar33;
        if (plVar17 < (long *)(uVar36 + (long)plVar33)) goto LAB_01bed9fa;
      }
      plVar13 = (long *)((long)plVar35 + 1);
      sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 5),(BYTE *)((long)plVar35 + -(ulong)local_cc + 5)
                          ,pInLimit);
      uVar36 = (long)plVar13 - (long)src;
      plVar35 = (long *)seqStore->lit;
      if (plVar1 < plVar13) {
        ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)plVar13,(BYTE *)plVar1);
        goto LAB_01becec6;
      }
      lVar25 = *(long *)((long)src + 8);
      *plVar35 = *src;
      plVar35[1] = lVar25;
      pBVar8 = seqStore->lit;
      if (uVar36 < 0x11) {
        seqStore->lit = pBVar8 + uVar36;
        psVar14 = seqStore->sequences;
      }
      else {
        lVar25 = *(long *)((long)src + 0x18);
        *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar8 + 0x18) = lVar25;
        if (0x20 < (long)uVar36) {
          lVar25 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar25 + 0x20);
            uVar10 = puVar3[1];
            pBVar2 = pBVar8 + lVar25 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar10;
            puVar3 = (undefined8 *)((long)src + lVar25 + 0x30);
            uVar10 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar10;
            lVar25 = lVar25 + 0x20;
          } while (pBVar2 + 0x20 < pBVar8 + uVar36);
        }
LAB_01becec6:
        seqStore->lit = seqStore->lit + uVar36;
        psVar14 = seqStore->sequences;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      lVar25 = sVar12 + 4;
      psVar14->litLength = (U16)uVar36;
      psVar14->offBase = 1;
      uVar36 = sVar12 + 1;
      plVar35 = plVar13;
      uVar20 = local_cc;
      goto joined_r0x01bed183;
    }
    goto LAB_01bed9fa;
  }
  if (uVar20 == 6) {
    bVar15 = 0x40 - cVar11;
    plVar1 = (long *)(pInLimit + -0x20);
LAB_01bec6d8:
    local_90 = (long *)src;
    if ((long *)((long)plVar35 + 1) <= plVar17) {
      uVar22 = (ulong)(*plVar35 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
      plVar13 = plVar35 + 0x20;
      uVar34 = (ulong)pUVar6[uVar22];
      plVar30 = (long *)(pBVar5 + uVar34);
      uVar36 = 1;
      lVar25 = *plVar35;
      plVar21 = (long *)((long)plVar35 + 1);
      while( true ) {
        plVar33 = plVar21;
        uVar24 = (ulong)(lVar25 * -0x30e4432340650000) >> (bVar15 & 0x3f);
        uVar20 = pUVar7[uVar24];
        iVar28 = (int)plVar35;
        UVar31 = iVar28 - iVar27;
        pUVar7[uVar24] = UVar31;
        pUVar6[uVar22] = UVar31;
        if ((local_cc != 0) &&
           (*(int *)((long)plVar35 + -(ulong)local_cc + 1) == *(int *)((long)plVar35 + 1))) break;
        lVar18 = *plVar33;
        uVar22 = (ulong)(lVar18 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
        iVar32 = (int)plVar33;
        if ((uVar16 < (uint)uVar34) && (*plVar30 == lVar25)) {
          sVar12 = ZSTD_count((BYTE *)(plVar35 + 1),(BYTE *)(plVar30 + 1),pInLimit);
          lVar25 = sVar12 + 8;
          local_b0 = iVar28 - (int)plVar30;
          for (plVar33 = plVar35;
              ((plVar29 < plVar30 && (src < plVar33)) &&
              (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar30 + -1)));
              plVar33 = (long *)((long)plVar33 + -1)) {
            plVar30 = (long *)((long)plVar30 + -1);
            lVar25 = lVar25 + 1;
          }
          goto LAB_01beca05;
        }
        uVar34 = (ulong)pUVar6[uVar22];
        plVar30 = (long *)(pBVar5 + uVar34);
        if ((uVar16 < uVar20) &&
           (plVar21 = (long *)(pBVar5 + uVar20), (int)*plVar21 == (int)*plVar35)) goto LAB_01bec941;
        if (plVar13 <= plVar33) {
          uVar36 = uVar36 + 1;
          plVar13 = plVar13 + 0x20;
        }
        lVar25 = lVar18;
        plVar21 = (long *)(uVar36 + (long)plVar33);
        plVar35 = plVar33;
        if (plVar17 < (long *)(uVar36 + (long)plVar33)) goto LAB_01bed9fa;
      }
      plVar33 = (long *)((long)plVar35 + 1);
      sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 5),(BYTE *)((long)plVar35 + -(ulong)local_cc + 5)
                          ,pInLimit);
      uVar36 = (long)plVar33 - (long)src;
      plVar35 = (long *)seqStore->lit;
      if (plVar1 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)plVar33,(BYTE *)plVar1);
        goto LAB_01bec84b;
      }
      lVar25 = *(long *)((long)src + 8);
      *plVar35 = *src;
      plVar35[1] = lVar25;
      pBVar8 = seqStore->lit;
      if (uVar36 < 0x11) {
        seqStore->lit = pBVar8 + uVar36;
        psVar14 = seqStore->sequences;
      }
      else {
        lVar25 = *(long *)((long)src + 0x18);
        *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar8 + 0x18) = lVar25;
        if (0x20 < (long)uVar36) {
          lVar25 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar25 + 0x20);
            uVar10 = puVar3[1];
            pBVar2 = pBVar8 + lVar25 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar10;
            puVar3 = (undefined8 *)((long)src + lVar25 + 0x30);
            uVar10 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar10;
            lVar25 = lVar25 + 0x20;
          } while (pBVar2 + 0x20 < pBVar8 + uVar36);
        }
LAB_01bec84b:
        seqStore->lit = seqStore->lit + uVar36;
        psVar14 = seqStore->sequences;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      lVar25 = sVar12 + 4;
      psVar14->litLength = (U16)uVar36;
      psVar14->offBase = 1;
      uVar36 = sVar12 + 1;
      uVar20 = local_cc;
      goto joined_r0x01becb10;
    }
    goto LAB_01bed9fa;
  }
  if (uVar20 != 7) {
    bVar15 = 0x20 - cVar11;
    plVar1 = (long *)(pInLimit + -0x20);
LAB_01bed3aa:
    local_90 = (long *)src;
    if ((long *)((long)plVar35 + 1) <= plVar17) {
      lVar25 = *plVar35;
      uVar34 = (ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
      plVar13 = plVar35 + 0x20;
      uVar22 = (ulong)pUVar6[uVar34];
      plVar30 = (long *)(pBVar5 + uVar22);
      uVar36 = 1;
      plVar21 = (long *)((long)plVar35 + 1);
      while( true ) {
        plVar33 = plVar21;
        uVar23 = (uint)((int)lVar25 * -0x61c8864f) >> (bVar15 & 0x1f);
        uVar20 = pUVar7[uVar23];
        iVar28 = (int)plVar35;
        UVar31 = iVar28 - iVar27;
        pUVar7[uVar23] = UVar31;
        pUVar6[uVar34] = UVar31;
        if ((local_cc != 0) &&
           (*(int *)((long)plVar35 + -(ulong)local_cc + 1) == *(int *)((long)plVar35 + 1))) break;
        lVar25 = *plVar33;
        uVar34 = (ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
        iVar32 = (int)plVar33;
        if ((uVar16 < (uint)uVar22) && (*plVar30 == *plVar35)) {
          sVar12 = ZSTD_count((BYTE *)(plVar35 + 1),(BYTE *)(plVar30 + 1),pInLimit);
          lVar25 = sVar12 + 8;
          litLimit_w_1._0_4_ = iVar28 - (int)plVar30;
          for (plVar33 = plVar35;
              ((plVar29 < plVar30 && (src < plVar33)) &&
              (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar30 + -1)));
              plVar33 = (long *)((long)plVar33 + -1)) {
            plVar30 = (long *)((long)plVar30 + -1);
            lVar25 = lVar25 + 1;
          }
          goto LAB_01bed6dd;
        }
        uVar22 = (ulong)pUVar6[uVar34];
        plVar30 = (long *)(pBVar5 + uVar22);
        if ((uVar16 < uVar20) &&
           (plVar21 = (long *)(pBVar5 + uVar20), (int)*plVar21 == (int)*plVar35)) goto LAB_01bed615;
        if (plVar13 <= plVar33) {
          uVar36 = uVar36 + 1;
          plVar13 = plVar13 + 0x20;
        }
        plVar21 = (long *)((long)plVar33 + uVar36);
        plVar35 = plVar33;
        if (plVar17 < (long *)((long)plVar33 + uVar36)) goto LAB_01bed9fa;
      }
      plVar33 = (long *)((long)plVar35 + 1);
      sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 5),(BYTE *)((long)plVar35 + -(ulong)local_cc + 5)
                          ,pInLimit);
      uVar36 = (long)plVar33 - (long)src;
      plVar35 = (long *)seqStore->lit;
      if (plVar1 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)plVar33,(BYTE *)plVar1);
        goto LAB_01bed517;
      }
      lVar25 = *(long *)((long)src + 8);
      *plVar35 = *src;
      plVar35[1] = lVar25;
      pBVar8 = seqStore->lit;
      if (uVar36 < 0x11) {
        seqStore->lit = pBVar8 + uVar36;
        psVar14 = seqStore->sequences;
      }
      else {
        lVar25 = *(long *)((long)src + 0x18);
        *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar8 + 0x18) = lVar25;
        if (0x20 < (long)uVar36) {
          lVar25 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar25 + 0x20);
            uVar10 = puVar3[1];
            pBVar2 = pBVar8 + lVar25 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar10;
            puVar3 = (undefined8 *)((long)src + lVar25 + 0x30);
            uVar10 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar10;
            lVar25 = lVar25 + 0x20;
          } while (pBVar2 + 0x20 < pBVar8 + uVar36);
        }
LAB_01bed517:
        seqStore->lit = seqStore->lit + uVar36;
        psVar14 = seqStore->sequences;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      lVar25 = sVar12 + 4;
      psVar14->litLength = (U16)uVar36;
      psVar14->offBase = 1;
      uVar36 = sVar12 + 1;
      uVar20 = local_cc;
      goto joined_r0x01bed7ee;
    }
    goto LAB_01bed9fa;
  }
  bVar15 = 0x40 - cVar11;
  plVar1 = (long *)(pInLimit + -0x20);
LAB_01bec019:
  local_90 = (long *)src;
  if (plVar17 < (long *)((long)plVar35 + 1U)) {
LAB_01bed9fa:
    if (uVar26 <= uVar19) {
      uVar26 = 0;
    }
    uVar16 = uVar26;
    if (local_cc != 0) {
      uVar16 = uVar4;
    }
    if (uVar4 <= uVar19) {
      uVar16 = uVar26;
      uVar4 = 0;
    }
    if (local_cc != 0) {
      uVar4 = local_cc;
    }
    if (local_b0 != 0) {
      uVar16 = local_b0;
    }
    *rep = uVar4;
    rep[1] = uVar16;
    return (long)pInLimit - (long)local_90;
  }
  uVar22 = (ulong)(*plVar35 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
  plVar13 = plVar35 + 0x20;
  uVar34 = (ulong)pUVar6[uVar22];
  plVar30 = (long *)(pBVar5 + uVar34);
  uVar36 = 1;
  lVar25 = *plVar35;
  plVar21 = (long *)((long)plVar35 + 1U);
  while( true ) {
    plVar33 = plVar21;
    uVar24 = (ulong)(lVar25 * -0x30e44323405a9d00) >> (bVar15 & 0x3f);
    uVar20 = pUVar7[uVar24];
    iVar28 = (int)plVar35;
    UVar31 = iVar28 - iVar27;
    pUVar7[uVar24] = UVar31;
    pUVar6[uVar22] = UVar31;
    if ((local_cc != 0) &&
       (*(int *)((long)plVar35 + -(ulong)local_cc + 1) == *(int *)((long)plVar35 + 1))) break;
    lVar18 = *plVar33;
    uVar22 = (ulong)(lVar18 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f);
    iVar32 = (int)plVar33;
    if ((uVar16 < (uint)uVar34) && (*plVar30 == lVar25)) {
      sVar12 = ZSTD_count((BYTE *)(plVar35 + 1),(BYTE *)(plVar30 + 1),pInLimit);
      lVar25 = sVar12 + 8;
      litLimit_w_1._0_4_ = iVar28 - (int)plVar30;
      for (plVar33 = plVar35;
          ((plVar29 < plVar30 && (src < plVar33)) &&
          (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar30 + -1)));
          plVar33 = (long *)((long)plVar33 + -1)) {
        plVar30 = (long *)((long)plVar30 + -1);
        lVar25 = lVar25 + 1;
      }
      goto LAB_01bec370;
    }
    uVar34 = (ulong)pUVar6[uVar22];
    plVar30 = (long *)(pBVar5 + uVar34);
    if ((uVar16 < uVar20) && (plVar21 = (long *)(pBVar5 + uVar20), (int)*plVar21 == (int)*plVar35))
    goto LAB_01bec2a7;
    if (plVar13 <= plVar33) {
      uVar36 = uVar36 + 1;
      plVar13 = plVar13 + 0x20;
    }
    lVar25 = lVar18;
    plVar21 = (long *)((long)plVar33 + uVar36);
    plVar35 = plVar33;
    if (plVar17 < (long *)((long)plVar33 + uVar36)) goto LAB_01bed9fa;
  }
  plVar33 = (long *)((long)plVar35 + 1);
  sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 5),(BYTE *)((long)plVar35 + -(ulong)local_cc + 5),
                      pInLimit);
  uVar36 = (long)plVar33 - (long)src;
  plVar35 = (long *)seqStore->lit;
  if (plVar1 < plVar33) {
    ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)plVar33,(BYTE *)plVar1);
    goto LAB_01bec1a3;
  }
  lVar25 = *(long *)((long)src + 8);
  *plVar35 = *src;
  plVar35[1] = lVar25;
  pBVar8 = seqStore->lit;
  if (uVar36 < 0x11) {
    seqStore->lit = pBVar8 + uVar36;
    psVar14 = seqStore->sequences;
  }
  else {
    lVar25 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar25;
    if (0x20 < (long)uVar36) {
      lVar25 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar25 + 0x20);
        uVar10 = puVar3[1];
        pBVar2 = pBVar8 + lVar25 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar10;
        puVar3 = (undefined8 *)((long)src + lVar25 + 0x30);
        uVar10 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar10;
        lVar25 = lVar25 + 0x20;
      } while (pBVar2 + 0x20 < pBVar8 + uVar36);
    }
LAB_01bec1a3:
    seqStore->lit = seqStore->lit + uVar36;
    psVar14 = seqStore->sequences;
    if (0xffff < uVar36) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  lVar25 = sVar12 + 4;
  psVar14->litLength = (U16)uVar36;
  psVar14->offBase = 1;
  uVar36 = sVar12 + 1;
  uVar20 = local_cc;
  goto joined_r0x01bec48d;
LAB_01becfbe:
  if ((uVar16 < pUVar6[uVar22]) && (*plVar30 == lVar18)) {
    sVar12 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar30 + 1),pInLimit);
    lVar25 = sVar12 + 8;
    uVar20 = iVar32 - (int)plVar30;
    for (; ((plVar35 = plVar33, plVar29 < plVar30 && (src < plVar33)) &&
           (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar30 + -1)));
        plVar33 = (long *)((long)plVar33 + -1)) {
      plVar30 = (long *)((long)plVar30 + -1);
      lVar25 = lVar25 + 1;
    }
  }
  else {
    sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar25 = sVar12 + 4;
    uVar20 = iVar28 - (int)plVar21;
    for (; ((plVar29 < plVar21 && (src < plVar35)) &&
           (*(BYTE *)((long)plVar35 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar35 = (long *)((long)plVar35 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar25 = lVar25 + 1;
    }
  }
LAB_01bed078:
  if (uVar36 < 4) {
    pUVar6[uVar22] = iVar32 - iVar27;
  }
  uVar36 = (long)plVar35 - (long)src;
  plVar13 = (long *)seqStore->lit;
  if (plVar1 < plVar35) {
    ZSTD_safecopyLiterals((BYTE *)plVar13,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar13 = *src;
    plVar13[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar36 < 0x11) {
      seqStore->lit = pBVar8 + uVar36;
      psVar14 = seqStore->sequences;
      goto LAB_01bed367;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar36) {
      lVar18 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar3[1];
        pBVar2 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar10;
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar2 + 0x20 < pBVar8 + uVar36);
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  psVar14 = seqStore->sequences;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_01bed367:
  psVar14->litLength = (U16)uVar36;
  psVar14->offBase = uVar20 + 3;
  uVar36 = lVar25 - 3;
  local_b0 = local_cc;
joined_r0x01bed183:
  local_cc = uVar20;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)((long)plVar35 + lVar25);
  psVar14->mlBase = (U16)uVar36;
  seqStore->sequences = psVar14 + 1;
  plVar35 = (long *)src;
  if (src <= plVar17) {
    uVar20 = UVar31 + 2;
    lVar25 = *(long *)(pBVar5 + uVar20);
    pUVar6[(ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar20;
    pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)src + -2) - iVar27;
    pUVar7[(ulong)(lVar25 * -0x30e4432345000000) >> (bVar15 & 0x3f)] = uVar20;
    pUVar7[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar15 & 0x3f)] =
         ((int)src + -1) - iVar27;
    uVar20 = local_b0;
    for (; local_b0 = uVar20, plVar35 = (long *)src, src <= plVar17;
        src = (void *)((long)src + sVar12 + 4)) {
      if ((local_b0 == 0) || ((int)*src != *(int *)((long)src - (ulong)local_b0))) break;
      sVar12 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b0)),
                          pInLimit);
      UVar31 = (int)src - iVar27;
      lVar25 = *src;
      pUVar7[(ulong)(lVar25 * -0x30e4432345000000) >> (bVar15 & 0x3f)] = UVar31;
      pUVar6[(ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar31;
      plVar35 = (long *)seqStore->lit;
      if (plVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)src,(BYTE *)plVar1);
      }
      else {
        lVar25 = *(long *)((long)src + 8);
        *plVar35 = *src;
        plVar35[1] = lVar25;
      }
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offBase = 1;
      if (0xffff < sVar12 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->mlBase = (U16)(sVar12 + 1);
      seqStore->sequences = psVar14 + 1;
      uVar20 = local_cc;
      local_cc = local_b0;
    }
  }
  goto LAB_01becd35;
LAB_01bec941:
  if ((uVar16 < pUVar6[uVar22]) && (*plVar30 == lVar18)) {
    sVar12 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar30 + 1),pInLimit);
    lVar25 = sVar12 + 8;
    local_b0 = iVar32 - (int)plVar30;
    for (; ((plVar29 < plVar30 && (src < plVar33)) &&
           (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar30 + -1)));
        plVar33 = (long *)((long)plVar33 + -1)) {
      plVar30 = (long *)((long)plVar30 + -1);
      lVar25 = lVar25 + 1;
    }
  }
  else {
    sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar25 = sVar12 + 4;
    local_b0 = iVar28 - (int)plVar21;
    for (plVar33 = plVar35;
        ((plVar29 < plVar21 && (src < plVar33)) &&
        (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar33 = (long *)((long)plVar33 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar25 = lVar25 + 1;
    }
  }
LAB_01beca05:
  if (uVar36 < 4) {
    pUVar6[uVar22] = iVar32 - iVar27;
  }
  uVar36 = (long)plVar33 - (long)src;
  plVar35 = (long *)seqStore->lit;
  if (plVar1 < plVar33) {
    ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)plVar33,(BYTE *)plVar1);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar35 = *src;
    plVar35[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar36 < 0x11) {
      seqStore->lit = pBVar8 + uVar36;
      psVar14 = seqStore->sequences;
      goto LAB_01becce9;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar36) {
      lVar18 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar3[1];
        pBVar2 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar10;
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar2 + 0x20 < pBVar8 + uVar36);
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  psVar14 = seqStore->sequences;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_01becce9:
  psVar14->litLength = (U16)uVar36;
  psVar14->offBase = local_b0 + 3;
  uVar36 = lVar25 - 3;
  uVar20 = local_b0;
  local_b0 = local_cc;
joined_r0x01becb10:
  local_cc = uVar20;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)((long)plVar33 + lVar25);
  psVar14->mlBase = (U16)uVar36;
  seqStore->sequences = psVar14 + 1;
  plVar35 = (long *)src;
  if (src <= plVar17) {
    uVar20 = UVar31 + 2;
    lVar25 = *(long *)(pBVar5 + uVar20);
    pUVar6[(ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar20;
    pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)src + -2) - iVar27;
    pUVar7[(ulong)(lVar25 * -0x30e4432340650000) >> (bVar15 & 0x3f)] = uVar20;
    pUVar7[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar15 & 0x3f)] =
         ((int)src + -1) - iVar27;
    uVar20 = local_b0;
    for (; local_b0 = uVar20, plVar35 = (long *)src, src <= plVar17;
        src = (void *)((long)src + sVar12 + 4)) {
      if ((local_b0 == 0) || ((int)*src != *(int *)((long)src - (ulong)local_b0))) break;
      sVar12 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b0)),
                          pInLimit);
      UVar31 = (int)src - iVar27;
      lVar25 = *src;
      pUVar7[(ulong)(lVar25 * -0x30e4432340650000) >> (bVar15 & 0x3f)] = UVar31;
      pUVar6[(ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar31;
      plVar35 = (long *)seqStore->lit;
      if (plVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)src,(BYTE *)plVar1);
      }
      else {
        lVar25 = *(long *)((long)src + 8);
        *plVar35 = *src;
        plVar35[1] = lVar25;
      }
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offBase = 1;
      if (0xffff < sVar12 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->mlBase = (U16)(sVar12 + 1);
      seqStore->sequences = psVar14 + 1;
      uVar20 = local_cc;
      local_cc = local_b0;
    }
  }
  goto LAB_01bec6d8;
LAB_01bed615:
  if ((uVar16 < pUVar6[uVar34]) && (*plVar30 == lVar25)) {
    sVar12 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar30 + 1),pInLimit);
    lVar25 = sVar12 + 8;
    litLimit_w_1._0_4_ = iVar32 - (int)plVar30;
    for (; ((plVar29 < plVar30 && (src < plVar33)) &&
           (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar30 + -1)));
        plVar33 = (long *)((long)plVar33 + -1)) {
      plVar30 = (long *)((long)plVar30 + -1);
      lVar25 = lVar25 + 1;
    }
  }
  else {
    sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar25 = sVar12 + 4;
    litLimit_w_1._0_4_ = iVar28 - (int)plVar21;
    for (plVar33 = plVar35;
        ((plVar29 < plVar21 && (src < plVar33)) &&
        (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar33 = (long *)((long)plVar33 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar25 = lVar25 + 1;
    }
  }
LAB_01bed6dd:
  if (uVar36 < 4) {
    pUVar6[uVar34] = iVar32 - iVar27;
  }
  uVar36 = (long)plVar33 - (long)src;
  plVar35 = (long *)seqStore->lit;
  if (plVar1 < plVar33) {
    ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)plVar33,(BYTE *)plVar1);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar35 = *src;
    plVar35[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar36 < 0x11) {
      seqStore->lit = pBVar8 + uVar36;
      psVar14 = seqStore->sequences;
      goto LAB_01bed9c8;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar36) {
      lVar18 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar3[1];
        pBVar2 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar10;
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar2 + 0x20 < pBVar8 + uVar36);
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  psVar14 = seqStore->sequences;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_01bed9c8:
  psVar14->litLength = (U16)uVar36;
  psVar14->offBase = (uint)litLimit_w_1 + 3;
  uVar36 = lVar25 - 3;
  uVar20 = (uint)litLimit_w_1;
  local_b0 = local_cc;
joined_r0x01bed7ee:
  local_cc = uVar20;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)((long)plVar33 + lVar25);
  psVar14->mlBase = (U16)uVar36;
  seqStore->sequences = psVar14 + 1;
  plVar35 = (long *)src;
  if (src <= plVar17) {
    uVar20 = UVar31 + 2;
    pUVar6[(ulong)(*(long *)(pBVar5 + uVar20) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar20;
    pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)src + -2) - iVar27;
    pUVar7[(uint)(*(int *)(pBVar5 + uVar20) * -0x61c8864f) >> (bVar15 & 0x1f)] = uVar20;
    pUVar7[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar15 & 0x1f)] =
         ((int)src + -1) - iVar27;
    uVar20 = local_b0;
    for (; local_b0 = uVar20, plVar35 = (long *)src, src <= plVar17;
        src = (void *)((long)src + sVar12 + 4)) {
      lVar25 = *src;
      if ((local_b0 == 0) || ((int)lVar25 != *(int *)((long)src - (ulong)local_b0))) break;
      sVar12 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b0)),
                          pInLimit);
      UVar31 = (int)src - iVar27;
      pUVar7[(uint)((int)lVar25 * -0x61c8864f) >> (bVar15 & 0x1f)] = UVar31;
      pUVar6[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar31;
      plVar35 = (long *)seqStore->lit;
      if (plVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)src,(BYTE *)plVar1);
      }
      else {
        lVar25 = *(long *)((long)src + 8);
        *plVar35 = *src;
        plVar35[1] = lVar25;
      }
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offBase = 1;
      if (0xffff < sVar12 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->mlBase = (U16)(sVar12 + 1);
      seqStore->sequences = psVar14 + 1;
      uVar20 = local_cc;
      local_cc = local_b0;
    }
  }
  goto LAB_01bed3aa;
LAB_01bec2a7:
  if ((uVar16 < pUVar6[uVar22]) && (*plVar30 == lVar18)) {
    sVar12 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar30 + 1),pInLimit);
    lVar25 = sVar12 + 8;
    litLimit_w_1._0_4_ = iVar32 - (int)plVar30;
    for (; ((plVar29 < plVar30 && (src < plVar33)) &&
           (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar30 + -1)));
        plVar33 = (long *)((long)plVar33 + -1)) {
      plVar30 = (long *)((long)plVar30 + -1);
      lVar25 = lVar25 + 1;
    }
  }
  else {
    sVar12 = ZSTD_count((BYTE *)((long)plVar35 + 4),(BYTE *)((long)plVar21 + 4),pInLimit);
    lVar25 = sVar12 + 4;
    litLimit_w_1._0_4_ = iVar28 - (int)plVar21;
    for (plVar33 = plVar35;
        ((plVar29 < plVar21 && (src < plVar33)) &&
        (*(BYTE *)((long)plVar33 + -1) == *(BYTE *)((long)plVar21 + -1)));
        plVar33 = (long *)((long)plVar33 + -1)) {
      plVar21 = (long *)((long)plVar21 + -1);
      lVar25 = lVar25 + 1;
    }
  }
LAB_01bec370:
  if (uVar36 < 4) {
    pUVar6[uVar22] = iVar32 - iVar27;
  }
  uVar36 = (long)plVar33 - (long)src;
  plVar35 = (long *)seqStore->lit;
  if (plVar1 < plVar33) {
    ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)plVar33,(BYTE *)plVar1);
  }
  else {
    lVar18 = *(long *)((long)src + 8);
    *plVar35 = *src;
    plVar35[1] = lVar18;
    pBVar8 = seqStore->lit;
    if (uVar36 < 0x11) {
      seqStore->lit = pBVar8 + uVar36;
      psVar14 = seqStore->sequences;
      goto LAB_01bec67e;
    }
    lVar18 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar18;
    if (0x20 < (long)uVar36) {
      lVar18 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x20);
        uVar10 = puVar3[1];
        pBVar2 = pBVar8 + lVar18 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar10;
        puVar3 = (undefined8 *)((long)src + lVar18 + 0x30);
        uVar10 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar10;
        lVar18 = lVar18 + 0x20;
      } while (pBVar2 + 0x20 < pBVar8 + uVar36);
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  psVar14 = seqStore->sequences;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_01bec67e:
  psVar14->litLength = (U16)uVar36;
  psVar14->offBase = (uint)litLimit_w_1 + 3;
  uVar36 = lVar25 - 3;
  uVar20 = (uint)litLimit_w_1;
  local_b0 = local_cc;
joined_r0x01bec48d:
  local_cc = uVar20;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)((long)plVar33 + lVar25);
  psVar14->mlBase = (U16)uVar36;
  seqStore->sequences = psVar14 + 1;
  plVar35 = (long *)src;
  if (src <= plVar17) {
    uVar20 = UVar31 + 2;
    lVar25 = *(long *)(pBVar5 + uVar20);
    pUVar6[(ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = uVar20;
    pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] =
         ((int)src + -2) - iVar27;
    pUVar7[(ulong)(lVar25 * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] = uVar20;
    pUVar7[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] =
         ((int)src + -1) - iVar27;
    uVar20 = local_b0;
    for (; local_b0 = uVar20, plVar35 = (long *)src, src <= plVar17;
        src = (void *)((long)src + sVar12 + 4)) {
      if ((local_b0 == 0) || ((int)*src != *(int *)((long)src - (ulong)local_b0))) break;
      sVar12 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b0)),
                          pInLimit);
      UVar31 = (int)src - iVar27;
      lVar25 = *src;
      pUVar7[(ulong)(lVar25 * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] = UVar31;
      pUVar6[(ulong)(lVar25 * -0x30e44323485a9b9d) >> (bVar9 & 0x3f)] = UVar31;
      plVar35 = (long *)seqStore->lit;
      if (plVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)src,(BYTE *)src,(BYTE *)plVar1);
      }
      else {
        lVar25 = *(long *)((long)src + 8);
        *plVar35 = *src;
        plVar35[1] = lVar25;
      }
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offBase = 1;
      if (0xffff < sVar12 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->mlBase = (U16)(sVar12 + 1);
      seqStore->sequences = psVar14 + 1;
      uVar20 = local_cc;
      local_cc = local_b0;
    }
  }
  goto LAB_01bec019;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}